

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall
Js::InterpreterStackFrame::ProcessThunk
          (InterpreterStackFrame *this,void *address,void *addressOfReturnAddress)

{
  Var pvVar1;
  undefined1 local_38 [8];
  PushPopFrameHelper pushPopFrameHelper;
  void *addressOfReturnAddress_local;
  void *address_local;
  InterpreterStackFrame *this_local;
  
  pushPopFrameHelper._16_8_ = addressOfReturnAddress;
  PushPopFrameHelper::PushPopFrameHelper
            ((PushPopFrameHelper *)local_38,this,address,addressOfReturnAddress);
  pvVar1 = Process(this);
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)local_38);
  return pvVar1;
}

Assistant:

_NOINLINE
        Var InterpreterStackFrame::ProcessThunk(void* address, void* addressOfReturnAddress)
    {
        PushPopFrameHelper pushPopFrameHelper(this, address, addressOfReturnAddress);
        return this->Process();
    }